

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

StringPtr __thiscall capnp::Schema::getShortDisplayName(Schema *this)

{
  ulong uVar1;
  Reader RVar2;
  StringPtr SVar3;
  Reader proto;
  Reader RStack_38;
  
  getProto(&RStack_38,this);
  RVar2 = capnp::schema::Node::Reader::getDisplayName(&RStack_38);
  if (RStack_38._reader.dataSize < 0x60) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)*(uint *)((long)RStack_38._reader.data + 8);
  }
  SVar3.content.ptr = RVar2.super_StringPtr.content.ptr + uVar1;
  SVar3.content.size_ = RVar2.super_StringPtr.content.size_ - uVar1;
  return (StringPtr)SVar3.content;
}

Assistant:

kj::StringPtr Schema::getShortDisplayName() const {
  auto proto = getProto();
  return proto.getDisplayName().slice(proto.getDisplayNamePrefixLength());
}